

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

string * __thiscall
spirv_cross::join<char_const*&,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,spirv_cross *this,char **ts,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2)

{
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1118 [4336];
  
  local_1118._4120_8_ = local_1118 + 0x1030;
  local_1118._0_8_ = (char *)0x0;
  local_1118._8_8_ = 0;
  local_1118._16_8_ = 0;
  local_1118._4128_8_ = 0;
  local_1118._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1118);
  inner::join_helper<char_const*&,std::__cxx11::string,std::__cxx11::string>
            ((StringStream<4096UL,_4096UL> *)local_1118,(char **)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts,ts_1);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1118);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}